

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O0

void __thiscall libtorrent::anon_unknown_6::ut_pex_plugin::tick(ut_pex_plugin *this)

{
  torrent *this_00;
  undefined8 this_01;
  bool bVar1;
  char cVar2;
  uchar uVar3;
  int iVar4;
  torrent_flags_t lhs;
  entry *peVar5;
  string_type *psVar6;
  reference pppVar7;
  basic_endpoint<boost::asio::ip::tcp> *other;
  socket_type *s;
  reference ep;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> out;
  pair<std::_Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_bool>
  pVar8;
  basic_endpoint<boost::asio::ip::tcp> *i;
  iterator __end2_1;
  iterator __begin2_1;
  set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range2_1;
  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> local_1ec;
  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> local_1eb;
  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> local_1ea;
  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> local_1e9;
  long lStack_1e8;
  pex_flags_t flags;
  torrent_peer *pi;
  bt_peer_connection *p;
  _Self local_1d0;
  iterator di;
  undefined1 local_1b4 [8];
  endpoint remote;
  peer_connection *peer;
  peer_iterator __end2;
  peer_iterator __begin2;
  torrent *__range2;
  undefined1 local_170 [4];
  int num_added;
  set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  dropped;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  plf6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pld6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla6_out;
  string *plf6;
  string_type *local_100;
  string *pld6;
  string_type *local_e8;
  string *pla6;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  plf_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pld_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla_out;
  string *plf;
  string_type *local_a0;
  string *pld;
  string_view local_88;
  string_type *local_78;
  string *pla;
  entry pex;
  duration<long,_std::ratio<1L,_1L>_> local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point now;
  unsigned_long local_18;
  ut_pex_plugin *local_10;
  ut_pex_plugin *this_local;
  
  local_10 = this;
  lhs = libtorrent::aux::torrent::flags(this->m_torrent);
  now.__d.__r = (duration)0x200000;
  local_18 = (unsigned_long)
             libtorrent::flags::operator&
                       (lhs.m_val,
                        (bitfield_flag<unsigned_long,_libtorrent::torrent_flags_tag,_void>)0x200000)
  ;
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_18);
  if (!bVar1) {
    local_30.__d.__r = (duration)libtorrent::aux::time_now();
    pex.super_variant_type.
    super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    ._36_4_ = 0x3c;
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_40,
               (int *)((long)&pex.super_variant_type.
                              super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                      + 0x24));
    local_38 = ::std::chrono::operator-(&local_30,&local_40);
    bVar1 = ::std::chrono::operator<(&local_38,&this->m_last_msg);
    if (!bVar1) {
      (this->m_last_msg).__d.__r = (rep)local_30.__d.__r;
      iVar4 = libtorrent::aux::torrent::num_peers(this->m_torrent);
      if (iVar4 != 0) {
        entry::entry((entry *)&pla);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_88,"added");
        peVar5 = entry::operator[]((entry *)&pla,local_88);
        local_78 = entry::string_abi_cxx11_(peVar5);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&plf,"dropped");
        peVar5 = entry::operator[]((entry *)&pla,_plf);
        local_a0 = entry::string_abi_cxx11_(peVar5);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&pla_out,"added.f");
        peVar5 = entry::operator[]((entry *)&pla,_pla_out);
        psVar6 = entry::string_abi_cxx11_(peVar5);
        ::std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::back_insert_iterator(&pld_out,local_78);
        ::std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::back_insert_iterator(&plf_out,local_a0);
        ::std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::back_insert_iterator
                  ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pla6,psVar6);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&pld6,"added6");
        peVar5 = entry::operator[]((entry *)&pla,_pld6);
        local_e8 = entry::string_abi_cxx11_(peVar5);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&plf6,"dropped6");
        peVar5 = entry::operator[]((entry *)&pla,_plf6);
        local_100 = entry::string_abi_cxx11_(peVar5);
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&pla6_out,"added6.f");
        peVar5 = entry::operator[]((entry *)&pla,_pla6_out);
        psVar6 = entry::string_abi_cxx11_(peVar5);
        ::std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::back_insert_iterator(&pld6_out,local_e8);
        ::std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::back_insert_iterator(&plf6_out,local_100);
        ::std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::back_insert_iterator
                  ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&dropped._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar6);
        ::std::
        set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::set((set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               *)local_170);
        ::std::
        set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::swap(&this->m_old_peers,
               (set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                *)local_170);
        this->m_peers_in_message = 0;
        __range2._4_4_ = 0;
        this_00 = this->m_torrent;
        __end2 = libtorrent::aux::torrent::begin(this_00);
        peer = (peer_connection *)libtorrent::aux::torrent::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                           *)&peer), bVar1) {
          pppVar7 = __gnu_cxx::
                    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    ::operator*(&__end2);
          remote.impl_.data_._20_8_ = *pppVar7;
          bVar1 = send_peer((peer_connection *)remote.impl_.data_._20_8_);
          if (bVar1) {
            other = (basic_endpoint<boost::asio::ip::tcp> *)
                    (**(code **)(*(long *)remote.impl_.data_._20_8_ + 0x80))();
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                      ((basic_endpoint<boost::asio::ip::tcp> *)local_1b4,other);
            pVar8 = ::std::
                    set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                    ::insert(&this->m_old_peers,(basic_endpoint<boost::asio::ip::tcp> *)local_1b4);
            di._M_node = (_Base_ptr)pVar8.first._M_node;
            local_1d0._M_node =
                 (_Base_ptr)
                 ::std::
                 set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                 ::find((set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                         *)local_170,(key_type *)local_1b4);
            p = (bt_peer_connection *)
                ::std::
                set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ::end((set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                       *)local_170);
            bVar1 = ::std::operator==(&local_1d0,(_Self *)&p);
            if (bVar1) {
              if (99 < __range2._4_4_) break;
              cVar2 = (**(code **)(*(long *)remote.impl_.data_._20_8_ + 0x20))();
              this_01 = remote.impl_.data_._20_8_;
              if (cVar2 == '\0') {
                bVar1 = libtorrent::aux::peer_connection::is_outgoing
                                  ((peer_connection *)remote.impl_.data_._20_8_);
                if (((!bVar1) &&
                    (lStack_1e8 = (**(code **)(*(long *)remote.impl_.data_._20_8_ + 0x38))(),
                    lStack_1e8 != 0)) && (*(short *)(lStack_1e8 + 0x18) != 0)) {
                  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                            ((basic_endpoint<boost::asio::ip::tcp> *)local_1b4,
                             *(unsigned_short *)(lStack_1e8 + 0x18));
                }
                bVar1 = libtorrent::aux::peer_connection::is_seed((peer_connection *)this_01);
                if (bVar1) {
                  local_1e9.m_val = '\x02';
                }
                else {
                  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
                  bitfield_flag(&local_1e9);
                }
                bVar1 = libtorrent::aux::bt_peer_connection::supports_encryption
                                  ((bt_peer_connection *)this_01);
                if (bVar1) {
                  local_1ea.m_val = '\x01';
                }
                else {
                  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
                  bitfield_flag(&local_1ea);
                }
                libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
                operator|=(&local_1e9,local_1ea);
                s = libtorrent::aux::peer_connection::get_socket((peer_connection *)this_01);
                bVar1 = libtorrent::aux::is_utp(s);
                if (bVar1) {
                  local_1eb.m_val = '\x04';
                }
                else {
                  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
                  bitfield_flag(&local_1eb);
                }
                libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
                operator|=(&local_1e9,local_1eb);
                bVar1 = libtorrent::aux::bt_peer_connection::supports_holepunch
                                  ((bt_peer_connection *)this_01);
                if (bVar1) {
                  local_1ec.m_val = '\b';
                }
                else {
                  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
                  bitfield_flag(&local_1ec);
                }
                libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
                operator|=(&local_1e9,local_1ec);
                bVar1 = libtorrent::aux::
                        is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                                  ((basic_endpoint<boost::asio::ip::tcp> *)local_1b4);
                if (bVar1) {
                  libtorrent::aux::
                  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                            ((basic_endpoint<boost::asio::ip::tcp> *)local_1b4,&pld_out);
                  uVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_unsigned_char
                                    ((bitfield_flag *)&local_1e9);
                  libtorrent::aux::
                  write_uint8<unsigned_char,std::back_insert_iterator<std::__cxx11::string>>
                            (uVar3,(back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&pla6);
                }
                else {
                  libtorrent::aux::
                  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                            ((basic_endpoint<boost::asio::ip::tcp> *)local_1b4,&pld6_out);
                  uVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_unsigned_char
                                    ((bitfield_flag *)&local_1e9);
                  libtorrent::aux::
                  write_uint8<unsigned_char,std::back_insert_iterator<std::__cxx11::string>>
                            (uVar3,(back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&dropped._M_t._M_impl.super__Rb_tree_header._M_node_count);
                }
                __range2._4_4_ = __range2._4_4_ + 1;
                this->m_peers_in_message = this->m_peers_in_message + 1;
              }
            }
            else {
              ::std::
              set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
              ::erase_abi_cxx11_((set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                                  *)local_170,(const_iterator)local_1d0._M_node);
            }
          }
          __gnu_cxx::
          __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
          ::operator++(&__end2);
        }
        __end2_1 = ::std::
                   set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ::begin((set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                            *)local_170);
        i = (basic_endpoint<boost::asio::ip::tcp> *)
            ::std::
            set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
            ::end((set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   *)local_170);
        while (bVar1 = ::std::operator!=(&__end2_1,(_Self *)&i), bVar1) {
          ep = ::std::
               _Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>::
               operator*(&__end2_1);
          bVar1 = libtorrent::aux::is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(ep);
          if (bVar1) {
            libtorrent::aux::
            write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                      (ep,&plf_out);
          }
          else {
            libtorrent::aux::
            write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                      (ep,&plf6_out);
          }
          this->m_peers_in_message = this->m_peers_in_message + 1;
          ::std::_Rb_tree_const_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>::
          operator++(&__end2_1);
        }
        ::std::vector<char,_std::allocator<char>_>::clear(&this->m_ut_pex_msg);
        out = ::std::back_inserter<std::vector<char,std::allocator<char>>>(&this->m_ut_pex_msg);
        bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  (out,(entry *)&pla);
        ::std::
        set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::~set((set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                *)local_170);
        entry::~entry((entry *)&pla);
      }
    }
  }
  return;
}

Assistant:

void tick() override
		{
			if (m_torrent.flags() & torrent_flags::disable_pex) return;

			time_point const now = aux::time_now();
			if (now - seconds(60) < m_last_msg) return;
			m_last_msg = now;

			if (m_torrent.num_peers() == 0) return;

			entry pex;
			std::string& pla = pex["added"].string();
			std::string& pld = pex["dropped"].string();
			std::string& plf = pex["added.f"].string();
			std::back_insert_iterator<std::string> pla_out(pla);
			std::back_insert_iterator<std::string> pld_out(pld);
			std::back_insert_iterator<std::string> plf_out(plf);
			std::string& pla6 = pex["added6"].string();
			std::string& pld6 = pex["dropped6"].string();
			std::string& plf6 = pex["added6.f"].string();
			std::back_insert_iterator<std::string> pla6_out(pla6);
			std::back_insert_iterator<std::string> pld6_out(pld6);
			std::back_insert_iterator<std::string> plf6_out(plf6);

			std::set<tcp::endpoint> dropped;
			m_old_peers.swap(dropped);

			m_peers_in_message = 0;
			int num_added = 0;
			for (auto const* peer : m_torrent)
			{
				if (!send_peer(*peer)) continue;

				tcp::endpoint remote = peer->remote();
				m_old_peers.insert(remote);

				auto const di = dropped.find(remote);
				if (di == dropped.end())
				{
					// don't write too big of a package
					if (num_added >= max_peer_entries) break;

					// only send proper bittorrent peers
					if (peer->type() != connection_type::bittorrent)
						continue;

					auto const* const p = static_cast<aux::bt_peer_connection const*>(peer);

					// if the peer has told us which port its listening on,
					// use that port. But only if we didn't connect to the peer.
					// if we connected to it, use the port we know works
					if (!p->is_outgoing())
					{
						aux::torrent_peer const* const pi = peer->peer_info_struct();
						if (pi != nullptr && pi->port > 0)
							remote.port(pi->port);
					}

					// no supported flags to set yet
					// 0x01 - peer supports encryption
					// 0x02 - peer is a seed
					// 0x04 - supports uTP. This is only a positive flags
					//        passing 0 doesn't mean the peer doesn't
					//        support uTP
					// 0x08 - supports hole punching protocol. If this
					//        flag is received from a peer, it can be
					//        used as a rendezvous point in case direct
					//        connections to the peer fail
					pex_flags_t flags = p->is_seed() ? pex_seed : pex_flags_t{};
#if !defined TORRENT_DISABLE_ENCRYPTION
					flags |= p->supports_encryption() ? pex_encryption : pex_flags_t{};
#endif
					flags |= is_utp(p->get_socket()) ? pex_utp : pex_flags_t{};
					flags |= p->supports_holepunch() ? pex_holepunch : pex_flags_t{};

					// i->first was added since the last time
					if (aux::is_v4(remote))
					{
						aux::write_endpoint(remote, pla_out);
						aux::write_uint8(static_cast<std::uint8_t>(flags), plf_out);
					}
					else
					{
						aux::write_endpoint(remote, pla6_out);
						aux::write_uint8(static_cast<std::uint8_t>(flags), plf6_out);
					}
					++num_added;
					++m_peers_in_message;
				}
				else
				{
					// this was in the previous message
					// so, it wasn't dropped
					dropped.erase(di);
				}
			}

			for (auto const& i : dropped)
			{
				if (aux::is_v4(i))
					aux::write_endpoint(i, pld_out);
				else
					aux::write_endpoint(i, pld6_out);
				++m_peers_in_message;
			}

			m_ut_pex_msg.clear();
			bencode(std::back_inserter(m_ut_pex_msg), pex);
		}